

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocator.cpp
# Opt level: O0

void __thiscall xscript::parser::register_allocator::release(register_allocator *this,int32_t r)

{
  int32_t local_14;
  register_allocator *prStack_10;
  int32_t r_local;
  register_allocator *this_local;
  
  local_14 = r;
  prStack_10 = this;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->regs,&local_14);
  return;
}

Assistant:

void register_allocator::release(int32_t r) {
    regs.push(r);
}